

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O3

int sprkStep_Resize(ARKodeMem ark_mem,N_Vector y0,sunrealtype hscale,sunrealtype t0,
                   ARKVecResizeFn resize,void *resize_data)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int error_code;
  char *msgfmt;
  long lrw_diff;
  long liw_diff;
  sunindextype lrw1;
  sunindextype liw1;
  long local_48;
  ARKVecResizeFn local_40;
  long local_38;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    msgfmt = "Time step module memory is NULL.";
    iVar3 = -0x15;
    error_code = -0x15;
    iVar2 = 0x2e8;
  }
  else {
    local_38 = 0;
    local_48 = 0;
    if (y0->ops->nvspace != (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
      N_VSpace(y0,&local_48,&local_38);
    }
    lrw_diff = local_48 - ark_mem->lrw1;
    liw_diff = local_38 - ark_mem->liw1;
    ark_mem->lrw1 = local_48;
    ark_mem->liw1 = local_38;
    local_40 = resize;
    iVar2 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                         (N_Vector *)((long)pvVar1 + 0x10));
    if (iVar2 == 0) {
      msgfmt = "Unable to resize vector";
      iVar3 = -0x14;
      error_code = -0x14;
      iVar2 = 0x112;
    }
    else {
      if (*(long *)((long)pvVar1 + 0x18) == 0) {
        return 0;
      }
      iVar2 = arkResizeVec(ark_mem,local_40,resize_data,lrw_diff,liw_diff,y0,
                           (N_Vector *)((long)pvVar1 + 0x18));
      if (iVar2 != 0) {
        return 0;
      }
      msgfmt = "Unable to resize vector";
      iVar3 = -0x14;
      error_code = -0x14;
      iVar2 = 0x11c;
    }
  }
  arkProcessError(ark_mem,error_code,iVar2,"sprkStep_Resize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_sprkstep.c"
                  ,msgfmt);
  return iVar3;
}

Assistant:

int sprkStep_Resize(ARKodeMem ark_mem, N_Vector y0,
                    SUNDIALS_MAYBE_UNUSED sunrealtype hscale,
                    SUNDIALS_MAYBE_UNUSED sunrealtype t0, ARKVecResizeFn resize,
                    void* resize_data)
{
  ARKodeSPRKStepMem step_mem = NULL;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int retval;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Determine change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL) { N_VSpace(y0, &lrw1, &liw1); }
  lrw_diff      = lrw1 - ark_mem->lrw1;
  liw_diff      = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* Resize the local vectors */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                    &step_mem->sdata))
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    "Unable to resize vector");
    return (ARK_MEM_FAIL);
  }

  if (step_mem->yerr)
  {
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                      &step_mem->yerr))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
  }

  return (ARK_SUCCESS);
}